

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O2

void show_enc_fps(RK_S64 total_time,RK_S64 total_count,RK_S64 last_time,RK_S64 last_count)

{
  _mpp_log_l((double)(((float)total_count * 1e+06) / (float)total_time),
             (double)(((float)last_count * 1e+06) / (float)last_time),4,"mpi_enc_utils",
             "encoded %10lld frame fps avg %7.2f ins %7.2f\n",0,total_count);
  return;
}

Assistant:

void show_enc_fps(RK_S64 total_time, RK_S64 total_count, RK_S64 last_time, RK_S64 last_count)
{
    float avg_fps = (float)total_count * 1000000 / total_time;
    float ins_fps = (float)last_count * 1000000 / last_time;

    mpp_log("encoded %10lld frame fps avg %7.2f ins %7.2f\n",
            total_count, avg_fps, ins_fps);
}